

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utility.cpp
# Opt level: O1

QString * errorCodeToUString(QString *__return_storage_ptr__,USTATUS errorCode)

{
  storage_type *psVar1;
  QByteArrayView QVar2;
  Data *local_28;
  char16_t *local_20;
  qsizetype local_18;
  
  switch(errorCode) {
  case 0:
    psVar1 = (storage_type *)0x7;
    break;
  case 1:
    psVar1 = (storage_type *)0x26;
    break;
  case 2:
    goto LAB_00165ed1;
  case 3:
    goto LAB_00165ed1;
  case 4:
    goto LAB_00165e97;
  case 5:
    goto LAB_00165f5e;
  case 6:
    goto LAB_00165f16;
  case 7:
    goto LAB_00165f33;
  case 8:
    goto LAB_00165f6f;
  case 9:
    psVar1 = (storage_type *)0x11;
    break;
  case 10:
    goto LAB_00165fb3;
  case 0xb:
LAB_00165f6f:
    psVar1 = (storage_type *)0xe;
    break;
  case 0xc:
    goto LAB_00165f91;
  case 0xd:
LAB_00165f33:
    psVar1 = (storage_type *)0x15;
    break;
  case 0xe:
    psVar1 = (storage_type *)0x16;
    break;
  case 0xf:
    goto LAB_00165ebd;
  case 0x10:
    goto LAB_00165f80;
  case 0x11:
    psVar1 = (storage_type *)0x34;
    break;
  case 0x12:
LAB_00165ebd:
    psVar1 = (storage_type *)0x13;
    break;
  case 0x13:
LAB_00165f91:
    psVar1 = (storage_type *)0xc;
    break;
  case 0x14:
    goto LAB_00165ef9;
  case 0x15:
    goto LAB_00165ef9;
  case 0x16:
    psVar1 = (storage_type *)0x1b;
    break;
  case 0x17:
    goto LAB_00165f80;
  case 0x18:
    goto LAB_00165f80;
  case 0x19:
    goto LAB_00165fa2;
  case 0x1a:
  case 0x28:
  case 0x29:
  case 0x2a:
  case 0x2b:
  case 0x2c:
  case 0x2d:
  case 0x2e:
  case 0x2f:
  case 0x30:
  case 0x31:
  case 0x33:
  case 0x34:
  case 0x35:
  case 0x36:
  case 0x37:
  case 0x38:
switchD_00165d2c_caseD_1a:
    usprintf(__return_storage_ptr__,"Unknown error %02lX");
    return __return_storage_ptr__;
  case 0x1b:
    goto LAB_00165fb3;
  case 0x1c:
    psVar1 = (storage_type *)0x24;
    break;
  case 0x1d:
    goto LAB_00165f5e;
  case 0x1e:
LAB_00165f5e:
    psVar1 = (storage_type *)0x14;
    break;
  case 0x1f:
LAB_00165f80:
    psVar1 = (storage_type *)0x1d;
    break;
  case 0x20:
LAB_00165fa2:
    psVar1 = (storage_type *)0x1f;
    break;
  case 0x21:
    goto LAB_00165e15;
  case 0x22:
LAB_00165fb3:
    psVar1 = (storage_type *)0x18;
    break;
  case 0x23:
    psVar1 = (storage_type *)0x1a;
    break;
  case 0x24:
LAB_00165e15:
    psVar1 = (storage_type *)0x17;
    break;
  case 0x25:
    goto LAB_00165f16;
  case 0x26:
    goto LAB_00165ef9;
  case 0x27:
LAB_00165ed1:
    psVar1 = (storage_type *)0x10;
    break;
  case 0x32:
LAB_00165f16:
    psVar1 = (storage_type *)0x12;
    break;
  case 0x39:
LAB_00165e97:
    psVar1 = (storage_type *)0xd;
    break;
  default:
    if (errorCode != 0xff) goto switchD_00165d2c_caseD_1a;
LAB_00165ef9:
    psVar1 = (storage_type *)0xf;
  }
  QVar2.m_data = psVar1;
  QVar2.m_size = (qsizetype)&local_28;
  QString::fromUtf8(QVar2);
  (__return_storage_ptr__->d).size = 0;
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (char16_t *)0x0;
  (__return_storage_ptr__->d).d = local_28;
  (__return_storage_ptr__->d).ptr = local_20;
  (__return_storage_ptr__->d).size = local_18;
  return __return_storage_ptr__;
}

Assistant:

UString errorCodeToUString(USTATUS errorCode)
{
    // TODO: improve
    switch (errorCode) {
        case U_SUCCESS:                         return UString("Success");
        case U_NOT_IMPLEMENTED:                 return UString("Not implemented");
        case U_INVALID_PARAMETER:               return UString("Function called with invalid parameter");
        case U_BUFFER_TOO_SMALL:                return UString("Buffer too small");
        case U_OUT_OF_RESOURCES:                return UString("Out of resources");
        case U_OUT_OF_MEMORY:                   return UString("Out of memory");
        case U_FILE_OPEN:                       return UString("File can't be opened");
        case U_FILE_READ:                       return UString("File can't be read");
        case U_FILE_WRITE:                      return UString("File can't be written");
        case U_ITEM_NOT_FOUND:                  return UString("Item not found");
        case U_UNKNOWN_ITEM_TYPE:               return UString("Unknown item type");
        case U_INVALID_FLASH_DESCRIPTOR:        return UString("Invalid flash descriptor");
        case U_INVALID_REGION:                  return UString("Invalid region");
        case U_EMPTY_REGION:                    return UString("Empty region");
        case U_BIOS_REGION_NOT_FOUND:           return UString("BIOS region not found");
        case U_VOLUMES_NOT_FOUND:               return UString("UEFI volumes not found");
        case U_INVALID_VOLUME:                  return UString("Invalid UEFI volume");
        case U_VOLUME_REVISION_NOT_SUPPORTED:   return UString("Volume revision not supported");
        case U_UNKNOWN_FFS:                     return UString("Unknown file system");
        case U_INVALID_FILE:                    return UString("Invalid file");
        case U_INVALID_SECTION:                 return UString("Invalid section");
        case U_UNKNOWN_SECTION:                 return UString("Unknown section");
        case U_STANDARD_COMPRESSION_FAILED:     return UString("Standard compression failed");
        case U_CUSTOMIZED_COMPRESSION_FAILED:   return UString("Customized compression failed");
        case U_STANDARD_DECOMPRESSION_FAILED:   return UString("Standard decompression failed");
        case U_CUSTOMIZED_DECOMPRESSION_FAILED: return UString("Customized decompression failed");
        case U_UNKNOWN_COMPRESSION_TYPE:        return UString("Unknown compression type");
        case U_UNKNOWN_EXTRACT_MODE:            return UString("Unknown extract mode");
        case U_UNKNOWN_REPLACE_MODE:            return UString("Unknown replace mode");
        case U_UNKNOWN_IMAGE_TYPE:              return UString("Unknown executable image type");
        case U_UNKNOWN_PE_OPTIONAL_HEADER_TYPE: return UString("Unknown PE optional header type");
        case U_UNKNOWN_RELOCATION_TYPE:         return UString("Unknown relocation type");
        case U_COMPLEX_BLOCK_MAP:               return UString("Block map structure too complex for correct analysis");
        case U_DIR_ALREADY_EXIST:               return UString("Directory already exists");
        case U_DIR_CREATE:                      return UString("Directory can't be created");
        case U_DIR_CHANGE:                      return UString("Change directory failed");
        case U_DEPEX_PARSE_FAILED:              return UString("Dependency expression parsing failed");
        case U_TRUNCATED_IMAGE:                 return UString("Image is truncated");
        case U_INVALID_CAPSULE:                 return UString("Invalid capsule");
        case U_STORES_NOT_FOUND:                return UString("Stores not found");
        case U_INVALID_STORE_SIZE:              return UString("Invalid store size");
        case U_INVALID_STORE:                   return UString("Invalid store");
        default:                                return usprintf("Unknown error %02lX", errorCode);
    }
}